

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int exprMightBeIndexed(SrcList *pFrom,Bitmask mPrereq,int *aiCurCol,Expr *pExpr,int op)

{
  int iTab;
  bool bVar1;
  u8 uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  Index *pIVar7;
  
  uVar2 = pExpr->op;
  if (op - 0x36U < 4 && uVar2 == 0xa5) {
    pExpr = ((pExpr->x).pList)->a[0].pExpr;
    uVar2 = pExpr->op;
  }
  if (uVar2 == 0x9e) {
    *aiCurCol = pExpr->iTable;
    aiCurCol[1] = (int)pExpr->iColumn;
    return 1;
  }
  if ((mPrereq ^ mPrereq - 1) <= mPrereq - 1) {
    return 0;
  }
  lVar5 = 0;
  if (1 < mPrereq) {
    do {
      lVar5 = lVar5 + 1;
      bVar1 = 3 < mPrereq;
      mPrereq = mPrereq >> 1;
    } while (bVar1);
  }
  pIVar7 = (pFrom->a[lVar5].pTab)->pIndex;
  if (pIVar7 != (Index *)0x0) {
    iTab = pFrom->a[lVar5].iCursor;
    do {
      if ((pIVar7->aColExpr != (ExprList *)0x0) &&
         (uVar4 = (ulong)pIVar7->nKeyCol, pIVar7->nKeyCol != 0)) {
        lVar5 = 4;
        uVar6 = 0;
        do {
          if (pIVar7->aiColumn[uVar6] == -2) {
            iVar3 = sqlite3ExprCompareSkip
                              (pExpr,*(Expr **)((long)pIVar7->aColExpr->a + lVar5 * 2 + -8),iTab);
            if (iVar3 == 0) {
              *aiCurCol = iTab;
              aiCurCol[1] = -2;
              return 1;
            }
            uVar4 = (ulong)pIVar7->nKeyCol;
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x10;
        } while (uVar6 < uVar4);
      }
      pIVar7 = pIVar7->pNext;
    } while (pIVar7 != (Index *)0x0);
  }
  return 0;
}

Assistant:

static int exprMightBeIndexed(
  SrcList *pFrom,        /* The FROM clause */
  Bitmask mPrereq,       /* Bitmask of FROM clause terms referenced by pExpr */
  int *aiCurCol,         /* Write the referenced table cursor & column here */
  Expr *pExpr,           /* An operand of a comparison operator */
  int op                 /* The specific comparison operator */
){
  /* If this expression is a vector to the left or right of a 
  ** inequality constraint (>, <, >= or <=), perform the processing 
  ** on the first element of the vector.  */
  assert( TK_GT+1==TK_LE && TK_GT+2==TK_LT && TK_GT+3==TK_GE );
  assert( TK_IS<TK_GE && TK_ISNULL<TK_GE && TK_IN<TK_GE );
  assert( op<=TK_GE );
  if( pExpr->op==TK_VECTOR && (op>=TK_GT && ALWAYS(op<=TK_GE)) ){
    pExpr = pExpr->x.pList->a[0].pExpr;
  }

  if( pExpr->op==TK_COLUMN ){
    aiCurCol[0] = pExpr->iTable;
    aiCurCol[1] = pExpr->iColumn;
    return 1;
  }
  if( mPrereq==0 ) return 0;                 /* No table references */
  if( (mPrereq&(mPrereq-1))!=0 ) return 0;   /* Refs more than one table */
  return exprMightBeIndexed2(pFrom,mPrereq,aiCurCol,pExpr);
}